

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

type_conflict2 __thiscall
args::ValueReader::operator()
          (ValueReader *this,string *name,string *value,tuple<int,_int> *destination)

{
  uint uVar1;
  long lVar2;
  ostream *poVar3;
  ParseError *this_00;
  string local_340;
  istringstream ss;
  uint auStack_300 [88];
  ostringstream problem;
  
  std::__cxx11::istringstream::istringstream((istringstream *)&ss,(string *)value,_S_in);
  operator>>((istream *)&ss,destination);
  uVar1 = *(uint *)((long)auStack_300 + *(long *)(_ss + -0x18));
  if ((uVar1 & 5) == 0) {
    std::ws<char,std::char_traits<char>>((istream *)&ss);
  }
  lVar2 = std::streambuf::in_avail();
  if (((uVar1 & 5) == 0) && (lVar2 < 1)) {
    std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
    return true;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&problem);
  poVar3 = std::operator<<((ostream *)&problem,"Argument \'");
  poVar3 = std::operator<<(poVar3,(string *)name);
  poVar3 = std::operator<<(poVar3,"\' received invalid value type \'");
  poVar3 = std::operator<<(poVar3,(string *)value);
  std::operator<<(poVar3,"\'");
  this_00 = (ParseError *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  ParseError::ParseError(this_00,&local_340);
  __cxa_throw(this_00,&ParseError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

typename std::enable_if<!std::is_assignable<T, std::string>::value, bool>::type
        operator ()(const std::string &name, const std::string &value, T &destination)
        {
            std::istringstream ss(value);
            bool failed = !(ss >> destination);

            if (!failed)
            {
                ss >> std::ws;
            }

            if (ss.rdbuf()->in_avail() > 0 || failed)
            {
#ifdef ARGS_NOEXCEPT
                (void)name;
                return false;
#else
                std::ostringstream problem;
                problem << "Argument '" << name << "' received invalid value type '" << value << "'";
                throw ParseError(problem.str());
#endif
            }
            return true;
        }